

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node *
lyd_new_anydata(lyd_node *parent,lys_module *module,char *name,void *value,
               LYD_ANYDATA_VALUETYPE value_type)

{
  int iVar1;
  lys_node *siblings;
  size_t sVar2;
  lyd_node *plVar3;
  LY_ERR *pLVar4;
  lys_node *local_40;
  lys_node *snode;
  
  if ((parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0) ||
     (snode._4_4_ = value_type, siblings = lyd_new_find_schema(parent,module,0),
     siblings == (lys_node *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
  }
  else {
    sVar2 = strlen(name);
    iVar1 = lys_get_data_sibling(module,siblings,name,(int)sVar2,LYS_ANYDATA,&local_40);
    if (local_40 != (lys_node *)0x0 && iVar1 == 0) {
      plVar3 = lyd_create_anydata(parent,local_40,value,snode._4_4_);
      return plVar3;
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_anydata(struct lyd_node *parent, const struct lys_module *module, const char *name,
                void *value, LYD_ANYDATA_VALUETYPE value_type)
{
    const struct lys_node *siblings, *snode;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 0);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_ANYDATA, &snode) || !snode) {
        return NULL;
    }

    return lyd_create_anydata(parent, snode, value, value_type);
}